

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O2

LY_ERR lyxml_next_attribute
                 (lyxml_ctx *xmlctx,char **prefix,size_t *prefix_len,char **name,size_t *name_len)

{
  ly_in *plVar1;
  ly_ctx *ctx;
  LY_ERR LVar2;
  uint uVar3;
  char *pcVar4;
  char cVar5;
  int iVar6;
  undefined1 auVar7 [16];
  ly_bool dynamic;
  ly_bool ws_only;
  char *in;
  uint32_t c;
  size_t *local_50;
  size_t parsed;
  char *value;
  size_t value_len;
  
  local_50 = prefix_len;
  do {
    plVar1 = xmlctx->in;
    pcVar4 = plVar1->current;
    cVar5 = *pcVar4;
    if (cVar5 != '\t') {
      if (cVar5 == '\n') {
        plVar1->line = plVar1->line + 1;
      }
      else if ((cVar5 != '\r') && (cVar5 != ' ')) break;
    }
    ly_in_skip(plVar1,1);
  } while( true );
LAB_00198755:
  LVar2 = LY_SUCCESS;
  if ((cVar5 != '/') && (cVar5 != '>')) {
    in = pcVar4;
    if (*pcVar4 == '\0') {
      ly_vlog(xmlctx->ctx,(char *)0x0,LYVE_SYNTAX,"Unexpected end-of-input.");
LAB_00198969:
      LVar2 = LY_EVALID;
    }
    else {
      LVar2 = ly_getutf8(&in,&c,&parsed);
      if (LVar2 != LY_SUCCESS) {
LAB_00198911:
        ctx = xmlctx->ctx;
        uVar3 = LY_VCODE_INSTREXP_len(in + -parsed);
        ly_vlog(ctx,(char *)0x0,LYVE_SYNTAX,"Invalid character sequence \"%.*s\", expected %s.",
                (ulong)uVar3,(long)in - parsed,"element tag end (\'>\' or \'/>\') or an attribute");
        goto LAB_00198969;
      }
      uVar3 = (c & 0xffffffdf) - 0x41;
      if ((0x19 < uVar3 && c != 0x5f) && (c == 0x37e || 0x1c8f < c - 0x370)) {
        auVar7._0_4_ = -(uint)(-0x7ffffee1 < (int)(c - 0x2070 ^ 0x80000000));
        auVar7._4_4_ = -(uint)(-0x7ffffc11 < (int)(c - 0x2c00 ^ 0x80000000));
        auVar7._8_4_ = -(uint)(-0x7fff5802 < (int)(c - 0x3001 ^ 0x80000000));
        auVar7._12_4_ = -(uint)(-0x7ffffb31 < (int)(c - 0xf900 ^ 0x80000000));
        iVar6 = movmskps(CONCAT31((int3)(uVar3 >> 8),c != 0x37e),auVar7);
        if (((iVar6 == 0xf) &&
            (((0x20d < c - 0xfdf0 && (0xdffff < c - 0x10000)) && ((c & 0xfffffffe) != 0x200c)))) &&
           (0x23f < c - 0xc0 || (c & 0xffffffdf) == 0xd7)) goto LAB_00198911;
      }
      LVar2 = lyxml_parse_qname(xmlctx,prefix,local_50,name,name_len);
      if (LVar2 == LY_SUCCESS) {
        if (*prefix == (char *)0x0) {
LAB_0019888f:
          iVar6 = ly_strncmp("xmlns",*name,*name_len);
          if (iVar6 != 0) {
            return LY_SUCCESS;
          }
        }
        else {
          iVar6 = ly_strncmp("xmlns",*prefix,*local_50);
          if (iVar6 != 0) {
            if (*prefix != (char *)0x0) {
              return LY_SUCCESS;
            }
            goto LAB_0019888f;
          }
        }
        LVar2 = lyxml_next_attr_content(xmlctx,&value,&value_len,&ws_only,&dynamic);
        if (LVar2 == LY_SUCCESS) {
          if (dynamic != '\0') {
            free(value);
          }
          do {
            plVar1 = xmlctx->in;
            pcVar4 = plVar1->current;
            cVar5 = *pcVar4;
            if (((cVar5 != '\t') && (cVar5 != ' ')) && (cVar5 != '\r')) {
              if (cVar5 != '\n') goto LAB_00198755;
              plVar1->line = plVar1->line + 1;
            }
            ly_in_skip(plVar1,1);
          } while( true );
        }
      }
    }
  }
  return LVar2;
}

Assistant:

static LY_ERR
lyxml_next_attribute(struct lyxml_ctx *xmlctx, const char **prefix, size_t *prefix_len, const char **name, size_t *name_len)
{
    const char *in;
    char *value;
    uint32_t c;
    size_t parsed, value_len;
    ly_bool ws_only, dynamic;

    /* skip WS */
    ign_xmlws(xmlctx);

    /* parse only possible attributes */
    while ((xmlctx->in->current[0] != '>') && (xmlctx->in->current[0] != '/')) {
        in = xmlctx->in->current;
        if (in[0] == '\0') {
            LOGVAL(xmlctx->ctx, LY_VCODE_EOF);
            return LY_EVALID;
        } else if ((ly_getutf8(&in, &c, &parsed) || !is_xmlqnamestartchar(c))) {
            LOGVAL(xmlctx->ctx, LY_VCODE_INSTREXP, LY_VCODE_INSTREXP_len(in - parsed), in - parsed,
                    "element tag end ('>' or '/>') or an attribute");
            return LY_EVALID;
        }

        /* parse attribute name */
        LY_CHECK_RET(lyxml_parse_qname(xmlctx, prefix, prefix_len, name, name_len));

        if ((!*prefix || ly_strncmp("xmlns", *prefix, *prefix_len)) && (*prefix || ly_strncmp("xmlns", *name, *name_len))) {
            /* standard attribute */
            break;
        }

        /* namespace, skip it */
        LY_CHECK_RET(lyxml_next_attr_content(xmlctx, (const char **)&value, &value_len, &ws_only, &dynamic));
        if (dynamic) {
            free(value);
        }

        /* skip WS */
        ign_xmlws(xmlctx);
    }

    return LY_SUCCESS;
}